

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_st_atomic(DisasContext_conflict10 *ctx,MemOp_conflict memop)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 v1;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGv_i64 EA_00;
  TCGv_i64 ret;
  TCGv_i64 val;
  TCGv_i64 val_00;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 ret_02;
  TCGv_i64 ea_plus_s;
  TCGv_i64 s2;
  TCGv_i64 s;
  TCGv_i64 t2;
  TCGv_i64 t;
  TCGv_i64 discard;
  TCGv_i64 src;
  TCGv_i64 EA;
  uint32_t gpr_FC;
  TCGContext_conflict10 *tcg_ctx;
  MemOp_conflict memop_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = FC(ctx->opcode);
  EA_00 = tcg_temp_new_i64(tcg_ctx_00);
  gen_addr_register(ctx,EA_00);
  uVar2 = rD(ctx->opcode);
  v1 = cpu_gpr[uVar2];
  ret = tcg_temp_new_i64(tcg_ctx_00);
  tcg_ctx._4_4_ = memop | MO_ALIGN;
  switch(uVar1) {
  case 0:
    tcg_gen_atomic_add_fetch_i64_ppc64(tcg_ctx_00,ret,EA_00,v1,(long)ctx->mem_idx,tcg_ctx._4_4_);
    break;
  case 1:
    tcg_gen_atomic_xor_fetch_i64_ppc64(tcg_ctx_00,ret,EA_00,v1,(long)ctx->mem_idx,tcg_ctx._4_4_);
    break;
  case 2:
    tcg_gen_atomic_or_fetch_i64_ppc64(tcg_ctx_00,ret,EA_00,v1,(long)ctx->mem_idx,tcg_ctx._4_4_);
    break;
  case 3:
    tcg_gen_atomic_and_fetch_i64_ppc64(tcg_ctx_00,ret,EA_00,v1,(long)ctx->mem_idx,tcg_ctx._4_4_);
    break;
  case 4:
    tcg_gen_atomic_umax_fetch_i64_ppc64(tcg_ctx_00,ret,EA_00,v1,(long)ctx->mem_idx,tcg_ctx._4_4_);
    break;
  case 5:
    tcg_gen_atomic_smax_fetch_i64_ppc64(tcg_ctx_00,ret,EA_00,v1,(long)ctx->mem_idx,tcg_ctx._4_4_);
    break;
  case 6:
    tcg_gen_atomic_umin_fetch_i64_ppc64(tcg_ctx_00,ret,EA_00,v1,(long)ctx->mem_idx,tcg_ctx._4_4_);
    break;
  case 7:
    tcg_gen_atomic_smin_fetch_i64_ppc64(tcg_ctx_00,ret,EA_00,v1,(long)ctx->mem_idx,tcg_ctx._4_4_);
    break;
  default:
    gen_exception_err(ctx,2,0x20);
    break;
  case 0x18:
    uVar1 = tb_cflags((ctx->base).tb);
    if ((uVar1 & 0x80000) == 0) {
      val = tcg_temp_new_i64(tcg_ctx_00);
      val_00 = tcg_temp_new_i64(tcg_ctx_00);
      ret_00 = tcg_temp_new_i64(tcg_ctx_00);
      ret_01 = tcg_temp_new_i64(tcg_ctx_00);
      ret_02 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val,EA_00,(long)ctx->mem_idx,tcg_ctx._4_4_);
      tcg_gen_addi_i64_ppc64(tcg_ctx_00,ret_02,EA_00,1L << ((byte)tcg_ctx._4_4_ & 3));
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val_00,ret_02,(long)ctx->mem_idx,tcg_ctx._4_4_);
      tcg_gen_movcond_i64_ppc64(tcg_ctx_00,TCG_COND_EQ,ret_00,val,val_00,v1,val);
      tcg_gen_movcond_i64_ppc64(tcg_ctx_00,TCG_COND_EQ,ret_01,val,val_00,v1,val_00);
      tcg_gen_qemu_st_i64_ppc64(tcg_ctx_00,ret_00,EA_00,(long)ctx->mem_idx,tcg_ctx._4_4_);
      tcg_gen_qemu_st_i64_ppc64(tcg_ctx_00,ret_01,ret_02,(long)ctx->mem_idx,tcg_ctx._4_4_);
      tcg_temp_free_i64(tcg_ctx_00,ret_02);
      tcg_temp_free_i64(tcg_ctx_00,ret_01);
      tcg_temp_free_i64(tcg_ctx_00,ret_00);
      tcg_temp_free_i64(tcg_ctx_00,val_00);
      tcg_temp_free_i64(tcg_ctx_00,val);
    }
    else {
      gen_helper_exit_atomic(tcg_ctx_00,tcg_ctx_00->cpu_env);
      (ctx->base).is_jmp = DISAS_NORETURN;
    }
  }
  tcg_temp_free_i64(tcg_ctx_00,ret);
  tcg_temp_free_i64(tcg_ctx_00,EA_00);
  return;
}

Assistant:

static void gen_st_atomic(DisasContext *ctx, MemOp memop)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t gpr_FC = FC(ctx->opcode);
    TCGv EA = tcg_temp_new(tcg_ctx);
    TCGv src, discard;

    gen_addr_register(ctx, EA);
    src = cpu_gpr[rD(ctx->opcode)];
    discard = tcg_temp_new(tcg_ctx);

    memop |= MO_ALIGN;
    switch (gpr_FC) {
    case 0: /* add and Store */
        tcg_gen_atomic_add_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 1: /* xor and Store */
        tcg_gen_atomic_xor_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 2: /* Or and Store */
        tcg_gen_atomic_or_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 3: /* 'and' and Store */
        tcg_gen_atomic_and_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 4:  /* Store max unsigned */
        tcg_gen_atomic_umax_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 5:  /* Store max signed */
        tcg_gen_atomic_smax_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 6:  /* Store min unsigned */
        tcg_gen_atomic_umin_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 7:  /* Store min signed */
        tcg_gen_atomic_smin_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 24: /* Store twin  */
        if (tb_cflags(ctx->base.tb) & CF_PARALLEL) {
            /* Restart with exclusive lock.  */
            gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
            ctx->base.is_jmp = DISAS_NORETURN;
        } else {
            TCGv t = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv s = tcg_temp_new(tcg_ctx);
            TCGv s2 = tcg_temp_new(tcg_ctx);
            TCGv ea_plus_s = tcg_temp_new(tcg_ctx);

            tcg_gen_qemu_ld_tl(tcg_ctx, t, EA, ctx->mem_idx, memop);
            tcg_gen_addi_tl(tcg_ctx, ea_plus_s, EA, MEMOP_GET_SIZE(memop));
            tcg_gen_qemu_ld_tl(tcg_ctx, t2, ea_plus_s, ctx->mem_idx, memop);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, s, t, t2, src, t);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, s2, t, t2, src, t2);
            tcg_gen_qemu_st_tl(tcg_ctx, s, EA, ctx->mem_idx, memop);
            tcg_gen_qemu_st_tl(tcg_ctx, s2, ea_plus_s, ctx->mem_idx, memop);

            tcg_temp_free(tcg_ctx, ea_plus_s);
            tcg_temp_free(tcg_ctx, s2);
            tcg_temp_free(tcg_ctx, s);
            tcg_temp_free(tcg_ctx, t2);
            tcg_temp_free(tcg_ctx, t);
        }
        break;
    default:
        /* invoke data storage error handler */
        gen_exception_err(ctx, POWERPC_EXCP_DSI, POWERPC_EXCP_INVAL);
    }
    tcg_temp_free(tcg_ctx, discard);
    tcg_temp_free(tcg_ctx, EA);
}